

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  __m256i alVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  __m256i *palVar9;
  __m256i c;
  ulong uVar10;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar11;
  __m256i *b_00;
  long lVar12;
  __m256i *palVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong size;
  __m256i *ptr;
  uint uVar23;
  long lVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 in_stack_ffffffffffffff18;
  long lVar41;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar42;
  __m256i *local_c0;
  undefined1 auVar31 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          parasail_sw_table_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_striped_profile_avx2_256_64_cold_1();
        }
        else {
          uVar15 = (ulong)uVar17 + 3;
          uVar10 = (ulong)ppVar4->max;
          uVar23 = (uint)uVar15 & 0x7ffffffc;
          result = parasail_result_new_table1(uVar23,s2Len);
          if (result != (parasail_result_t *)0x0) {
            uVar42 = 0;
            size = uVar15 >> 2;
            result->flag = result->flag | 0x4820804;
            b = parasail_memalign___m256i(0x20,size);
            palVar11 = parasail_memalign___m256i(0x20,size);
            local_c0 = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            uVar20 = 0;
            if ((b_00 != (__m256i *)0x0 && local_c0 != (__m256i *)0x0) &&
                (palVar11 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              auVar27._4_4_ = 0;
              auVar27._0_4_ = open;
              auVar27._8_4_ = open;
              auVar27._12_4_ = 0;
              auVar27._16_4_ = open;
              auVar27._20_4_ = 0;
              auVar27._24_4_ = open;
              auVar27._28_4_ = 0;
              auVar28._4_4_ = 0;
              auVar28._0_4_ = gap;
              auVar28._8_4_ = gap;
              auVar28._12_4_ = 0;
              auVar28._16_4_ = gap;
              auVar28._20_4_ = 0;
              auVar28._24_4_ = gap;
              auVar28._28_4_ = 0;
              lVar12 = ~uVar10 + 0x7fffffffffffffff;
              alVar2[1]._0_4_ = open;
              alVar2[0] = in_stack_ffffffffffffff18;
              alVar2[1]._4_4_ = in_stack_ffffffffffffff24;
              alVar2[2]._0_4_ = s2Len;
              alVar2[2]._4_4_ = uVar42;
              alVar2[3] = lVar12;
              parasail_memset___m256i(b,alVar2,size);
              c[1]._0_4_ = open;
              c[0] = in_stack_ffffffffffffff18;
              c[1]._4_4_ = in_stack_ffffffffffffff24;
              c[2]._0_4_ = s2Len;
              c[2]._4_4_ = uVar42;
              c[3] = lVar12;
              parasail_memset___m256i(b_00,c,size);
              iVar8 = (int)size;
              uVar10 = (ulong)(uint)s2Len;
              lVar18 = size * uVar10;
              lVar41 = -0x4000000000000000;
              auVar30._8_8_ = 0xc000000000000000;
              auVar30._0_8_ = 0xc000000000000000;
              auVar30._16_8_ = 0xc000000000000000;
              auVar30._24_8_ = 0xc000000000000000;
              auVar31 = ZEXT3264(auVar30);
              lVar21 = 0;
              uVar22 = 0;
              auVar29 = ZEXT3264(auVar30);
              do {
                ptr = b;
                iVar16 = ppVar4->mapper[(byte)s2[uVar22]];
                iVar19 = (int)uVar20;
                palVar13 = local_c0;
                b = palVar11;
                if (iVar19 == (uint)uVar22 - 2) {
                  palVar13 = palVar11;
                  b = local_c0;
                }
                alVar2 = ptr[iVar8 - 1];
                auVar30 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                auVar30 = vpalignr_avx2((undefined1  [32])alVar2,auVar30,8);
                lVar14 = 0;
                auVar36 = ZEXT1664((undefined1  [16])0x0);
                lVar24 = lVar21;
                do {
                  auVar34 = vpaddq_avx2(auVar30,*(undefined1 (*) [32])
                                                 ((long)pvVar3 + lVar14 + (long)iVar16 * size * 0x20
                                                 ));
                  auVar30 = *(undefined1 (*) [32])((long)*b_00 + lVar14);
                  auVar35 = vpcmpgtq_avx2(auVar34,auVar30);
                  auVar34 = vblendvpd_avx(auVar30,auVar34,auVar35);
                  auVar33 = auVar36._0_32_;
                  auVar35 = vpcmpgtq_avx2(auVar34,auVar33);
                  auVar34 = vblendvpd_avx(auVar33,auVar34,auVar35);
                  auVar35 = vpcmpgtq_avx2(auVar34,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar35 = vpand_avx2(auVar35,auVar34);
                  *(undefined1 (*) [32])((long)*b + lVar14) = auVar35;
                  piVar5 = ((result->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar24) = auVar35._0_4_;
                  *(int *)((long)piVar5 + lVar18 * 4 + lVar24) = auVar35._8_4_;
                  *(int *)((long)piVar5 + lVar18 * 8 + lVar24) = auVar35._16_4_;
                  *(int *)((long)piVar5 + lVar18 * 0xc + lVar24) = auVar35._24_4_;
                  auVar34 = vpcmpgtq_avx2(auVar35,auVar29._0_32_);
                  auVar34 = vblendvpd_avx(auVar29._0_32_,auVar35,auVar34);
                  auVar29 = ZEXT3264(auVar34);
                  auVar34 = vpsubq_avx2(auVar35,auVar27);
                  auVar35 = vpsubq_avx2(auVar30,auVar28);
                  auVar30 = vpcmpgtq_avx2(auVar35,auVar34);
                  auVar30 = vblendvpd_avx(auVar34,auVar35,auVar30);
                  *(undefined1 (*) [32])((long)*b_00 + lVar14) = auVar30;
                  auVar35 = vpsubq_avx2(auVar33,auVar28);
                  auVar30 = vpcmpgtq_avx2(auVar35,auVar34);
                  auVar30 = vblendvpd_avx(auVar34,auVar35,auVar30);
                  auVar36 = ZEXT3264(auVar30);
                  auVar30 = *(undefined1 (*) [32])((long)*ptr + lVar14);
                  lVar14 = lVar14 + 0x20;
                  lVar24 = lVar24 + uVar10 * 4;
                } while (size << 5 != lVar14);
                iVar16 = 0;
                do {
                  auVar34 = auVar36._0_32_;
                  auVar30 = vperm2f128_avx(auVar34,auVar34,8);
                  auVar30 = vpalignr_avx2(auVar34,auVar30,8);
                  auVar36 = ZEXT3264(auVar30);
                  lVar14 = 0;
                  lVar24 = lVar21;
                  do {
                    auVar30 = *(undefined1 (*) [32])((long)*b + lVar14);
                    auVar35 = auVar36._0_32_;
                    auVar34 = vpcmpgtq_avx2(auVar30,auVar35);
                    auVar30 = vblendvpd_avx(auVar35,auVar30,auVar34);
                    *(undefined1 (*) [32])((long)*b + lVar14) = auVar30;
                    piVar5 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar24) = auVar30._0_4_;
                    uVar42 = vextractps_avx(auVar30._0_16_,2);
                    *(undefined4 *)((long)piVar5 + lVar18 * 4 + lVar24) = uVar42;
                    *(int *)((long)piVar5 + lVar18 * 8 + lVar24) = auVar30._16_4_;
                    uVar42 = vextractps_avx(auVar30._16_16_,2);
                    *(undefined4 *)((long)piVar5 + lVar18 * 0xc + lVar24) = uVar42;
                    auVar34 = vpcmpgtq_avx2(auVar30,auVar29._0_32_);
                    auVar34 = vblendvpd_avx(auVar29._0_32_,auVar30,auVar34);
                    auVar29 = ZEXT3264(auVar34);
                    auVar30 = vpsubq_avx2(auVar30,auVar27);
                    auVar35 = vpsubq_avx2(auVar35,auVar28);
                    auVar36 = ZEXT3264(auVar35);
                    auVar30 = vpcmpgtq_avx2(auVar35,auVar30);
                    if ((((auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar30 >> 0x7f,0) == '\0') && SUB321(auVar30 >> 0xbf,0) == '\0') &&
                        -1 < auVar30[0x1f]) goto LAB_007c04c3;
                    lVar14 = lVar14 + 0x20;
                    lVar24 = lVar24 + uVar10 * 4;
                  } while (size << 5 != lVar14);
                  iVar16 = iVar16 + 1;
                } while (iVar16 != 4);
LAB_007c04c3:
                auVar30 = vpcmpgtq_avx2(auVar34,auVar31._0_32_);
                if ((((auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') || SUB321(auVar30 >> 0xbf,0) != '\0') ||
                    auVar30[0x1f] < '\0') {
                  lVar24 = auVar34._0_8_;
                  if (auVar34._0_8_ < auVar34._16_8_) {
                    lVar24 = auVar34._16_8_;
                  }
                  lVar41 = vpextrq_avx(auVar34._0_16_,1);
                  lVar14 = vpextrq_avx(auVar34._16_16_,1);
                  if (lVar41 < lVar14) {
                    lVar41 = lVar14;
                  }
                  if (lVar41 <= lVar24) {
                    lVar41 = lVar24;
                  }
                  if (lVar12 < lVar41) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    s2Len = (uint)uVar22;
                    goto LAB_007c0548;
                  }
                  auVar31 = ZEXT3264(CONCAT824(lVar41,CONCAT816(lVar41,CONCAT88(lVar41,lVar41))));
                  uVar20 = uVar22 & 0xffffffff;
                }
                iVar19 = (int)uVar20;
                uVar22 = uVar22 + 1;
                lVar21 = lVar21 + 4;
                palVar11 = ptr;
                local_c0 = palVar13;
                if (uVar22 == uVar10) {
LAB_007c0548:
                  if (lVar41 == 0x7fffffffffffffff) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar16 = parasail_result_is_saturated(result);
                  palVar11 = palVar13;
                  if (iVar16 == 0) {
                    palVar9 = ptr;
                    if (iVar19 == s2Len - 2U) {
                      palVar11 = ptr;
                      palVar9 = palVar13;
                    }
                    if (iVar19 == s2Len - 1U) {
                      palVar11 = b;
                      b = palVar13;
                      palVar9 = ptr;
                    }
                    ptr = palVar9;
                    uVar17 = uVar17 - 1;
                    bVar25 = (uVar15 & 0x7ffffffc) == 0;
                    if (!bVar25) {
                      if (bVar25) {
                        uVar15 = 0;
                        do {
                          uVar23 = (uint)(uVar15 >> 2) & 0x3fffffff;
                          if ((int)uVar17 <= (int)uVar23) {
                            uVar23 = uVar17;
                          }
                          if ((*palVar11)[uVar15] == lVar41) {
                            uVar17 = uVar23;
                          }
                          uVar15 = uVar15 + 1;
                        } while ((int)uVar15 != 0);
                      }
                      else {
                        auVar26._4_4_ = uVar17;
                        auVar26._0_4_ = uVar17;
                        auVar26._8_4_ = uVar17;
                        auVar26._12_4_ = uVar17;
                        auVar32._4_4_ = iVar8;
                        auVar32._0_4_ = iVar8;
                        auVar32._8_4_ = iVar8;
                        auVar32._12_4_ = iVar8;
                        auVar7 = vpmovsxbd_avx(ZEXT416(0x3020100));
                        uVar15 = 0;
                        auVar37._8_4_ = 3;
                        auVar37._0_8_ = 0x300000003;
                        auVar37._12_4_ = 3;
                        auVar38._8_4_ = 4;
                        auVar38._0_8_ = 0x400000004;
                        auVar38._12_4_ = 4;
                        do {
                          plVar1 = *palVar11 + uVar15;
                          auVar39._0_8_ = -(ulong)(lVar41 == *plVar1);
                          auVar39._8_8_ = -(ulong)(lVar41 == plVar1[1]);
                          auVar34._16_8_ =
                               -(ulong)(lVar41 == SUB248(*(undefined1 (*) [24])plVar1,0x10));
                          auVar34._0_16_ = auVar39;
                          auVar34._24_8_ = -(ulong)(lVar41 == plVar1[3]);
                          auVar39 = vpackssdw_avx(auVar39,auVar34._16_16_);
                          auVar40 = vpsrld_avx(auVar7,2);
                          auVar6 = vpand_avx(auVar7,auVar37);
                          auVar6 = vpmulld_avx(auVar6,auVar32);
                          auVar6 = vpaddd_avx(auVar6,auVar40);
                          auVar6 = vpminsd_avx(auVar6,auVar26);
                          auVar26 = vblendvps_avx(auVar26,auVar6,auVar39);
                          uVar15 = uVar15 + 4;
                          auVar7 = vpaddd_avx(auVar7,auVar38);
                        } while (uVar23 != uVar15);
                        auVar7 = vpshufd_avx(auVar26,0xee);
                        auVar26 = vpminsd_avx(auVar26,auVar7);
                        auVar7 = vpshufd_avx(auVar26,0x55);
                        auVar26 = vpminsd_avx(auVar26,auVar7);
                        uVar17 = auVar26._0_4_;
                      }
                    }
                  }
                  else {
                    iVar19 = 0;
                    lVar41 = 0xffffffff;
                    uVar17 = 0;
                  }
                  result->score = (int)lVar41;
                  result->end_query = uVar17;
                  result->end_ref = iVar19;
                  parasail_free(b_00);
                  parasail_free(palVar11);
                  parasail_free(ptr);
                  parasail_free(b);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int64_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}